

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

void __thiscall
GenericModel::multiData(GenericModel *this,QModelIndex *index,QModelRoleDataSpan roleDataSpan)

{
  QModelRoleData *this_00;
  QModelRoleDataSpan *this_01;
  QVariant local_a0;
  QVariant local_80;
  int local_5c;
  QModelRoleData *pQStack_58;
  int role;
  QModelRoleData *roleData;
  QModelRoleData *__end1;
  QModelRoleData *__begin1;
  QModelRoleDataSpan *__range1;
  GenericModelItem *item;
  GenericModelPrivate *d;
  QModelIndex *index_local;
  GenericModel *this_local;
  QModelRoleDataSpan roleDataSpan_local;
  
  roleDataSpan_local.m_modelRoleData = (QModelRoleData *)roleDataSpan.m_len;
  this_local = (GenericModel *)roleDataSpan.m_modelRoleData;
  d = (GenericModelPrivate *)index;
  index_local = (QModelIndex *)this;
  item = (GenericModelItem *)d_func(this);
  __range1 = (QModelRoleDataSpan *)
             GenericModelPrivate::itemForIndex((GenericModelPrivate *)item,(QModelIndex *)d);
  __begin1 = (QModelRoleData *)&this_local;
  __end1 = QModelRoleDataSpan::begin((QModelRoleDataSpan *)__begin1);
  roleData = QModelRoleDataSpan::end((QModelRoleDataSpan *)__begin1);
  for (; __end1 != roleData; __end1 = __end1 + 0x28) {
    pQStack_58 = __end1;
    local_5c = QModelRoleData::role(__end1);
    this_00 = pQStack_58;
    if ((((ulong)(item->children).d.ptr & 1) != 0) && (local_5c == 2)) {
      local_5c = 0;
    }
    this_01 = __range1 + 1;
    ::QVariant::QVariant(&local_a0);
    QMap<int,_QVariant>::value(&local_80,(QMap<int,_QVariant> *)this_01,&local_5c,&local_a0);
    QModelRoleData::setData<QVariant>(this_00,&local_80);
    ::QVariant::~QVariant(&local_80);
    ::QVariant::~QVariant(&local_a0);
  }
  return;
}

Assistant:

void GenericModel::multiData(const QModelIndex &index, QModelRoleDataSpan roleDataSpan) const
{
    Q_ASSERT(index.isValid() && index.model() == this);
    Q_D(const GenericModel);
    const GenericModelItem *const item = d->itemForIndex(index);
    for (QModelRoleData &roleData : roleDataSpan) {
        int role = roleData.role();
        if (d->m_mergeDisplayEdit && role == Qt::EditRole)
            role = Qt::DisplayRole;
        roleData.setData(item->data.value(role));
    }
}